

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O2

void aom_img_truncate_16_to_8(aom_image_t *dst,aom_image_t *src)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  uchar *puVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  
  if ((((dst->fmt + 0x800 == src->fmt) && (dst->d_w == src->d_w)) && (dst->d_h == src->d_h)) &&
     (((dst->x_chroma_shift == src->x_chroma_shift && (dst->y_chroma_shift == src->y_chroma_shift))
      && (uVar5 = dst->fmt - AOM_IMG_FMT_I420, uVar5 < 5)))) {
    if ((0x19U >> (uVar5 & 0x1f) & 1) != 0) {
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        uVar5 = src->d_w;
        uVar8 = src->d_h;
        if (lVar7 != 0) {
          uVar5 = uVar5 + src->x_chroma_shift >> ((byte)src->x_chroma_shift & 0x1f);
          uVar8 = uVar8 + src->y_chroma_shift >> ((byte)src->y_chroma_shift & 0x1f);
        }
        uVar6 = 0;
        if ((int)uVar5 < 1) {
          uVar5 = uVar6;
        }
        if ((int)uVar8 < 1) {
          uVar8 = 0;
        }
        for (; uVar6 != uVar8; uVar6 = uVar6 + 1) {
          iVar1 = src->stride[lVar7];
          puVar3 = src->planes[lVar7];
          iVar2 = dst->stride[lVar7];
          puVar4 = dst->planes[lVar7];
          for (lVar9 = 0; uVar5 != (uint)lVar9; lVar9 = lVar9 + 1) {
            puVar4[lVar9 + (int)(iVar2 * uVar6)] = puVar3[lVar9 * 2 + (long)(int)(iVar1 * uVar6)];
          }
        }
      }
      return;
    }
  }
  fatal("Unsupported image conversion");
}

Assistant:

void aom_img_truncate_16_to_8(aom_image_t *dst, const aom_image_t *src) {
  int plane;
  if (dst->fmt + AOM_IMG_FMT_HIGHBITDEPTH != src->fmt || dst->d_w != src->d_w ||
      dst->d_h != src->d_h || dst->x_chroma_shift != src->x_chroma_shift ||
      dst->y_chroma_shift != src->y_chroma_shift) {
    fatal("Unsupported image conversion");
  }
  switch (dst->fmt) {
    case AOM_IMG_FMT_I420:
    case AOM_IMG_FMT_I422:
    case AOM_IMG_FMT_I444: break;
    default: fatal("Unsupported image conversion");
  }
  for (plane = 0; plane < 3; plane++) {
    int w = src->d_w;
    int h = src->d_h;
    int x, y;
    if (plane) {
      w = (w + src->x_chroma_shift) >> src->x_chroma_shift;
      h = (h + src->y_chroma_shift) >> src->y_chroma_shift;
    }
    for (y = 0; y < h; y++) {
      const uint16_t *p_src =
          (const uint16_t *)(src->planes[plane] + y * src->stride[plane]);
      uint8_t *p_dst = dst->planes[plane] + y * dst->stride[plane];
      for (x = 0; x < w; x++) {
        *p_dst++ = (uint8_t)(*p_src++);
      }
    }
  }
}